

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DebugHookIdInfo(ImGuiID id,ImGuiDataType data_type,void *data_id,void *data_id_end)

{
  int *piVar1;
  int iVar2;
  ImGuiWindow *pIVar3;
  ImGuiStackLevelInfo *pIVar4;
  bool bVar5;
  ImGuiContext *pIVar6;
  ImGuiStackLevelInfo *__dest;
  long lVar7;
  size_t sVar8;
  uint uVar9;
  ulong uVar10;
  char *pcVar11;
  int iVar12;
  long lVar13;
  ImGuiContext *ctx;
  int iVar14;
  
  pIVar6 = GImGui;
  uVar10 = (ulong)id;
  pIVar3 = GImGui->CurrentWindow;
  iVar2 = (GImGui->DebugStackTool).StackLevel;
  lVar13 = (long)iVar2;
  if (lVar13 == -1) {
    (GImGui->DebugStackTool).StackLevel = 0;
    iVar14 = (pIVar3->IDStack).Size;
    iVar2 = iVar14 + 1;
    iVar12 = (pIVar6->DebugStackTool).Results.Capacity;
    if (iVar12 <= iVar14) {
      if (iVar12 == 0) {
        iVar12 = 8;
      }
      else {
        iVar12 = iVar12 / 2 + iVar12;
      }
      if (iVar12 <= iVar2) {
        iVar12 = iVar2;
      }
      piVar1 = &(pIVar6->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
      __dest = (ImGuiStackLevelInfo *)
               (*GImAllocatorAllocFunc)((long)iVar12 << 6,GImAllocatorUserData);
      pIVar4 = (pIVar6->DebugStackTool).Results.Data;
      if (pIVar4 != (ImGuiStackLevelInfo *)0x0) {
        memcpy(__dest,pIVar4,(long)(pIVar6->DebugStackTool).Results.Size << 6);
        pIVar4 = (pIVar6->DebugStackTool).Results.Data;
        if ((pIVar4 != (ImGuiStackLevelInfo *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
      }
      (pIVar6->DebugStackTool).Results.Data = __dest;
      (pIVar6->DebugStackTool).Results.Capacity = iVar12;
    }
    iVar12 = (pIVar6->DebugStackTool).Results.Size;
    if (iVar12 <= iVar14) {
      iVar14 = (iVar14 - iVar12) + 1;
      lVar13 = (long)iVar12 << 6;
      do {
        pIVar4 = (pIVar6->DebugStackTool).Results.Data;
        pcVar11 = pIVar4->Desc + lVar13 + 0x29;
        pcVar11[0] = '\0';
        pcVar11[1] = '\0';
        pcVar11[2] = '\0';
        pcVar11[3] = '\0';
        pcVar11[4] = '\0';
        pcVar11[5] = '\0';
        pcVar11[6] = '\0';
        pcVar11[7] = '\0';
        pcVar11[8] = '\0';
        pcVar11[9] = '\0';
        pcVar11[10] = '\0';
        pcVar11[0xb] = '\0';
        pcVar11[0xc] = '\0';
        pcVar11[0xd] = '\0';
        pcVar11[0xe] = '\0';
        pcVar11[0xf] = '\0';
        pcVar11 = pIVar4->Desc + lVar13 + 0x19;
        pcVar11[0] = '\0';
        pcVar11[1] = '\0';
        pcVar11[2] = '\0';
        pcVar11[3] = '\0';
        pcVar11[4] = '\0';
        pcVar11[5] = '\0';
        pcVar11[6] = '\0';
        pcVar11[7] = '\0';
        pcVar11[8] = '\0';
        pcVar11[9] = '\0';
        pcVar11[10] = '\0';
        pcVar11[0xb] = '\0';
        pcVar11[0xc] = '\0';
        pcVar11[0xd] = '\0';
        pcVar11[0xe] = '\0';
        pcVar11[0xf] = '\0';
        pcVar11 = pIVar4->Desc + lVar13 + 9;
        pcVar11[0] = '\0';
        pcVar11[1] = '\0';
        pcVar11[2] = '\0';
        pcVar11[3] = '\0';
        pcVar11[4] = '\0';
        pcVar11[5] = '\0';
        pcVar11[6] = '\0';
        pcVar11[7] = '\0';
        pcVar11[8] = '\0';
        pcVar11[9] = '\0';
        pcVar11[10] = '\0';
        pcVar11[0xb] = '\0';
        pcVar11[0xc] = '\0';
        pcVar11[0xd] = '\0';
        pcVar11[0xe] = '\0';
        pcVar11[0xf] = '\0';
        pcVar11 = pIVar4->Desc + lVar13 + -7;
        pcVar11[0] = '\0';
        pcVar11[1] = '\0';
        pcVar11[2] = '\0';
        pcVar11[3] = '\0';
        pcVar11[4] = '\0';
        pcVar11[5] = '\0';
        pcVar11[6] = '\0';
        pcVar11[7] = '\0';
        pcVar11[8] = '\0';
        pcVar11[9] = '\0';
        pcVar11[10] = '\0';
        pcVar11[0xb] = '\0';
        pcVar11[0xc] = '\0';
        pcVar11[0xd] = '\0';
        pcVar11[0xe] = '\0';
        pcVar11[0xf] = '\0';
        lVar13 = lVar13 + 0x40;
        iVar14 = iVar14 + -1;
      } while (iVar14 != 0);
    }
    (pIVar6->DebugStackTool).Results.Size = iVar2;
    uVar9 = (pIVar3->IDStack).Size;
    uVar10 = (ulong)uVar9;
    if ((int)uVar9 < 0) {
      return;
    }
    lVar7 = 0;
    lVar13 = 0;
    do {
      uVar9 = id;
      if (lVar13 < (int)uVar10) {
        uVar9 = (pIVar3->IDStack).Data[lVar13];
      }
      *(uint *)(((pIVar6->DebugStackTool).Results.Data)->Desc + lVar7 + -7) = uVar9;
      uVar10 = (ulong)(pIVar3->IDStack).Size;
      lVar7 = lVar7 + 0x40;
      bVar5 = lVar13 < (long)uVar10;
      lVar13 = lVar13 + 1;
    } while (bVar5);
    return;
  }
  if (iVar2 != (pIVar3->IDStack).Size) {
    return;
  }
  pIVar4 = (GImGui->DebugStackTool).Results.Data;
  switch(data_type) {
  case 4:
    pcVar11 = "%d";
    uVar10 = (ulong)data_id & 0xffffffff;
    goto LAB_001e1394;
  case 0xb:
    if (data_id_end == (void *)0x0) {
      sVar8 = strlen((char *)data_id);
    }
    else {
      sVar8 = (long)data_id_end - (long)data_id;
    }
    ImFormatString(pIVar4[lVar13].Desc,0x39,"%.*s",sVar8,data_id);
    break;
  case 0xc:
    ImFormatString(pIVar4[lVar13].Desc,0x39,"(void*)0x%p",data_id);
    break;
  case 0xd:
    if (pIVar4[lVar13].Desc[0] != '\0') {
      return;
    }
    pcVar11 = "0x%08X [override]";
LAB_001e1394:
    ImFormatString(pIVar4[lVar13].Desc,0x39,pcVar11,uVar10);
  }
  pIVar4[lVar13].QuerySuccess = true;
  pIVar4[lVar13].field_0x6 = (char)data_type;
  return;
}

Assistant:

void ImGui::DebugHookIdInfo(ImGuiID id, ImGuiDataType data_type, const void* data_id, const void* data_id_end)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiStackTool* tool = &g.DebugStackTool;

    // Step 0: stack query
    // This assumes that the ID was computed with the current ID stack, which tends to be the case for our widget.
    if (tool->StackLevel == -1)
    {
        tool->StackLevel++;
        tool->Results.resize(window->IDStack.Size + 1, ImGuiStackLevelInfo());
        for (int n = 0; n < window->IDStack.Size + 1; n++)
            tool->Results[n].ID = (n < window->IDStack.Size) ? window->IDStack[n] : id;
        return;
    }

    // Step 1+: query for individual level
    IM_ASSERT(tool->StackLevel >= 0);
    if (tool->StackLevel != window->IDStack.Size)
        return;
    ImGuiStackLevelInfo* info = &tool->Results[tool->StackLevel];
    IM_ASSERT(info->ID == id && info->QueryFrameCount > 0);

    switch (data_type)
    {
    case ImGuiDataType_S32:
        ImFormatString(info->Desc, IM_ARRAYSIZE(info->Desc), "%d", (int)(intptr_t)data_id);
        break;
    case ImGuiDataType_String:
        ImFormatString(info->Desc, IM_ARRAYSIZE(info->Desc), "%.*s", data_id_end ? (int)((const char*)data_id_end - (const char*)data_id) : (int)strlen((const char*)data_id), (const char*)data_id);
        break;
    case ImGuiDataType_Pointer:
        ImFormatString(info->Desc, IM_ARRAYSIZE(info->Desc), "(void*)0x%p", data_id);
        break;
    case ImGuiDataType_ID:
        if (info->Desc[0] != 0) // PushOverrideID() is often used to avoid hashing twice, which would lead to 2 calls to DebugHookIdInfo(). We prioritize the first one.
            return;
        ImFormatString(info->Desc, IM_ARRAYSIZE(info->Desc), "0x%08X [override]", id);
        break;
    default:
        IM_ASSERT(0);
    }
    info->QuerySuccess = true;
    info->DataType = data_type;
}